

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int impliesNotNullRow(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  uint uVar2;
  
  if ((pExpr->flags & 1) == 0) {
    bVar1 = pExpr->op;
    uVar2 = (uint)bVar1;
    if (bVar1 < 0x91) {
      if (0x39 < uVar2) {
        return 0;
      }
      if ((0x3f0000000000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        if ((0x6280000080000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          return 0;
        }
      }
      else if ((pExpr->pLeft->op != 0x9e) || (((pExpr->pLeft->y).pTab)->nModuleArg == 0)) {
        if (pExpr->pRight->op != 0x9e) {
          return 0;
        }
        if (((pExpr->pRight->y).pTab)->nModuleArg == 0) {
          return 0;
        }
      }
    }
    else if ((1 < bVar1 - 0x9c) && (bVar1 != 0x91)) {
      if (uVar2 != 0x9e) {
        return 0;
      }
      if ((pWalker->u).n == pExpr->iTable) {
        pWalker->eCode = '\x01';
        return 2;
      }
    }
  }
  return 1;
}

Assistant:

static int impliesNotNullRow(Walker *pWalker, Expr *pExpr){
  testcase( pExpr->op==TK_AGG_COLUMN );
  testcase( pExpr->op==TK_AGG_FUNCTION );
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return WRC_Prune;
  switch( pExpr->op ){
    case TK_ISNOT:
    case TK_NOT:
    case TK_ISNULL:
    case TK_IS:
    case TK_OR:
    case TK_CASE:
    case TK_IN:
    case TK_FUNCTION:
      testcase( pExpr->op==TK_ISNOT );
      testcase( pExpr->op==TK_NOT );
      testcase( pExpr->op==TK_ISNULL );
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_OR );
      testcase( pExpr->op==TK_CASE );
      testcase( pExpr->op==TK_IN );
      testcase( pExpr->op==TK_FUNCTION );
      return WRC_Prune;
    case TK_COLUMN:
      if( pWalker->u.iCur==pExpr->iTable ){
        pWalker->eCode = 1;
        return WRC_Abort;
      }
      return WRC_Prune;

    /* Virtual tables are allowed to use constraints like x=NULL.  So
    ** a term of the form x=y does not prove that y is not null if x
    ** is the column of a virtual table */
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
      testcase( pExpr->op==TK_EQ );
      testcase( pExpr->op==TK_NE );
      testcase( pExpr->op==TK_LT );
      testcase( pExpr->op==TK_LE );
      testcase( pExpr->op==TK_GT );
      testcase( pExpr->op==TK_GE );
      if( (pExpr->pLeft->op==TK_COLUMN && IsVirtual(pExpr->pLeft->y.pTab))
       || (pExpr->pRight->op==TK_COLUMN && IsVirtual(pExpr->pRight->y.pTab))
      ){
       return WRC_Prune;
      }
    default:
      return WRC_Continue;
  }
}